

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O3

int zip_extract(char *zipname,char *dir,_func_int_char_ptr_void_ptr *on_extract,void *arg)

{
  mz_bool mVar1;
  int iVar2;
  mz_zip_archive zip_archive;
  mz_zip_archive local_88;
  
  iVar2 = -0x16;
  if (dir != (char *)0x0 && zipname != (char *)0x0) {
    local_88.m_pIO_opaque = (void *)0x0;
    local_88.m_pState = (mz_zip_internal_state *)0x0;
    local_88.m_pWrite = (mz_file_write_func)0x0;
    local_88.m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
    local_88.m_pAlloc_opaque = (void *)0x0;
    local_88.m_pRead = (mz_file_read_func)0x0;
    local_88.m_pFree = (mz_free_func)0x0;
    local_88.m_pRealloc = (mz_realloc_func)0x0;
    local_88.m_file_offset_alignment = 0;
    local_88.m_pAlloc = (mz_alloc_func)0x0;
    local_88.m_total_files = 0;
    local_88.m_zip_mode = MZ_ZIP_MODE_INVALID;
    local_88.m_zip_type = MZ_ZIP_TYPE_INVALID;
    local_88.m_last_error = MZ_ZIP_NO_ERROR;
    local_88.m_archive_size = 0;
    local_88.m_central_directory_file_ofs = 0;
    mVar1 = mz_zip_reader_init_file_v2(&local_88,zipname,0,0,0);
    if (mVar1 == 0) {
      iVar2 = -1;
    }
    else {
      iVar2 = zip_archive_extract(&local_88,dir,on_extract,arg);
    }
  }
  return iVar2;
}

Assistant:

int zip_extract(const char *zipname, const char *dir,
                int (*on_extract)(const char *filename, void *arg), void *arg) {
  mz_zip_archive zip_archive;

  if (!zipname || !dir) {
    // Cannot parse zip archive name
    return ZIP_EINVZIPNAME;
  }

  if (!memset(&zip_archive, 0, sizeof(mz_zip_archive))) {
    // Cannot memset zip archive
    return ZIP_EMEMSET;
  }

  // Now try to open the archive.
  if (!mz_zip_reader_init_file(&zip_archive, zipname, 0)) {
    // Cannot initialize zip_archive reader
    return ZIP_ENOINIT;
  }

  return zip_archive_extract(&zip_archive, dir, on_extract, arg);
}